

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O0

QualifiedIdentifier * __thiscall
soul::StructuralParser::parseQualifiedIdentifier(StructuralParser *this)

{
  bool bVar1;
  StructuralParser *pSVar2;
  Identifier IVar3;
  pool_ptr<soul::AST::Expression> local_1a0;
  IdentifierPath local_198;
  UTF8Reader local_140;
  int local_134;
  pool_ptr<soul::AST::Expression> local_130;
  IdentifierPath local_128;
  char *local_d0;
  undefined1 local_c8 [8];
  pool_ptr<soul::AST::Expression> s;
  UTF8Reader p;
  IdentifierPath path;
  Context local_38;
  StructuralParser *local_20;
  QualifiedIdentifier *qi;
  StructuralParser *this_local;
  
  qi = (QualifiedIdentifier *)this;
  getContext(&local_38,this);
  pSVar2 = (StructuralParser *)
           allocate<soul::AST::QualifiedIdentifier,soul::AST::Context>(this,&local_38);
  AST::Context::~Context(&local_38);
  local_20 = pSVar2;
  do {
    IVar3 = parseIdentifier(this);
    IdentifierPath::IdentifierPath((IdentifierPath *)&stack0xffffffffffffff60,IVar3);
    while (bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                   ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x4ae19b), bVar1
          ) {
      IVar3 = parseIdentifier(this);
      IdentifierPath::addSuffix((IdentifierPath *)&stack0xffffffffffffff60,IVar3);
    }
    Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
    ::getCurrentTokeniserPosition
              ((Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                *)&s);
    parseSpecialisationArgs((StructuralParser *)local_c8);
    local_d0 = "::";
    bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
            ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x4ae19b);
    pSVar2 = local_20;
    if (bVar1) {
      IdentifierPath::IdentifierPath(&local_128,(IdentifierPath *)&stack0xffffffffffffff60);
      local_130.object = (Expression *)local_c8;
      AST::QualifiedIdentifier::addToPath((QualifiedIdentifier *)pSVar2,&local_128,&local_130);
      pool_ptr<soul::AST::Expression>::~pool_ptr(&local_130);
      IdentifierPath::~IdentifierPath(&local_128);
      local_134 = 3;
    }
    else {
      UTF8Reader::UTF8Reader(&local_140,(UTF8Reader *)&s);
      Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
      ::resetPosition(&this->super_SOULTokeniser,&local_140);
      pSVar2 = local_20;
      IdentifierPath::IdentifierPath(&local_198,(IdentifierPath *)&stack0xffffffffffffff60);
      pool_ptr<soul::AST::Expression>::pool_ptr(&local_1a0,(void *)0x0);
      AST::QualifiedIdentifier::addToPath((QualifiedIdentifier *)pSVar2,&local_198,&local_1a0);
      pool_ptr<soul::AST::Expression>::~pool_ptr(&local_1a0);
      IdentifierPath::~IdentifierPath(&local_198);
      this_local = local_20;
      local_134 = 1;
    }
    pool_ptr<soul::AST::Expression>::~pool_ptr((pool_ptr<soul::AST::Expression> *)local_c8);
    IdentifierPath::~IdentifierPath((IdentifierPath *)&stack0xffffffffffffff60);
  } while (local_134 != 1);
  return (QualifiedIdentifier *)this_local;
}

Assistant:

AST::QualifiedIdentifier& parseQualifiedIdentifier()
    {
        auto& qi = allocate<AST::QualifiedIdentifier> (getContext());

        for (;;)
        {
            IdentifierPath path (parseIdentifier());

            while (matchIf (Operator::doubleColon))
                path.addSuffix (parseIdentifier());

            auto p = getCurrentTokeniserPosition();
            auto s = parseSpecialisationArgs();

            if (matchIf (Operator::doubleColon))
            {
                qi.addToPath (path, s);
                continue;
            }

            resetPosition (p);
            qi.addToPath (path, nullptr);
            return qi;
        }
    }